

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int multipleBordersNearby(double latDeg,double lonDeg,Territory territory)

{
  Territory territory_00;
  int iVar1;
  Point32 local_44;
  Point32 coord32;
  int upto;
  int from;
  int nrFound;
  int m;
  Territory parentTerritoryCode;
  Territory ccode;
  Territory territory_local;
  double lonDeg_local;
  double latDeg_local;
  
  if ((_TERRITORY_MIN < territory) && (territory != TERRITORY_AAA)) {
    territory_00 = getParentCountryOf(territory);
    if ((territory_00 != TERRITORY_NONE) &&
       (iVar1 = multipleBordersNearby(latDeg,lonDeg,territory_00), iVar1 != 0)) {
      return 1;
    }
    upto = 0;
    coord32.lonMicroDeg = firstRec(territory);
    coord32.latMicroDeg = lastRec(territory);
    convertCoordsToMicrosAndFractions(&local_44,(int *)0x0,(int *)0x0,latDeg,lonDeg);
    for (from = coord32.latMicroDeg; coord32.lonMicroDeg <= from; from = from + -1) {
      if ((((TERRITORY_BOUNDARIES[from].flags & 0x200U) == 0) &&
          (iVar1 = isNearBorderOf(&local_44,TERRITORY_BOUNDARIES + from), iVar1 != 0)) &&
         (upto = upto + 1, 1 < upto)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int multipleBordersNearby(double latDeg, double lonDeg, enum Territory territory) {
    const enum Territory ccode = territory;
    if ((ccode > _TERRITORY_MIN) && (ccode != TERRITORY_AAA)) { // valid territory, not earth
        const enum Territory parentTerritoryCode = getParentCountryOf(territory);
        if (parentTerritoryCode != TERRITORY_NONE) {
            // there is a parent! check its borders as well...
            if (multipleBordersNearby(latDeg, lonDeg, parentTerritoryCode)) {
                return 1;
            }
        }
        {
            int m;
            int nrFound = 0;
            const int from = firstRec(ccode);
            const int upto = lastRec(ccode);
            Point32 coord32;
            convertCoordsToMicrosAndFractions(&coord32, NULL, NULL, latDeg, lonDeg);
            for (m = upto; m >= from; m--) {
                if (!IS_RESTRICTED(m)) {
                    if (isNearBorderOf(&coord32, TERRITORY_BOUNDARY(m))) {
                        nrFound++;
                        if (nrFound > 1) {
                            return 1;
                        }
                    }
                }
            }
        }
    }
    return 0;
}